

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

int __thiscall gl4cts::VertexAttrib64BitTests::init(VertexAttrib64BitTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Base *pBVar1;
  VAOTest *this_00;
  
  pBVar1 = (Base *)operator_new(0x1ab0);
  VertexAttrib64Bit::Base::Base
            (pBVar1,(this->super_TestCaseGroup).m_context,"api_errors",
             "Verify that API routines provoke errors as specified");
  (pBVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020dd1e0;
  *(undefined4 *)&pBVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar1);
  pBVar1 = (Base *)operator_new(0x1ad0);
  VertexAttrib64Bit::Base::Base
            (pBVar1,(this->super_TestCaseGroup).m_context,"get_vertex_attrib",
             "Verify that GetVertexAttribL* routines");
  (pBVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020dd218;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pBVar1[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       (pointer)0xc030624dd2f1a9fc;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
       0x4030624dd2f1a9fc;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar1);
  pBVar1 = (Base *)operator_new(0x1ab8);
  VertexAttrib64Bit::Base::Base
            (pBVar1,(this->super_TestCaseGroup).m_context,"limits_test",
             "Verify that maximum allowed number of attribiutes can be used");
  (pBVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020dd250;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pBVar1[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar1);
  this_00 = (VAOTest *)operator_new(0x1bb0);
  VertexAttrib64Bit::VAOTest::VAOTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void VertexAttrib64BitTests::init(void)
{
	addChild(new VertexAttrib64Bit::ApiErrorsTest(m_context));
	addChild(new VertexAttrib64Bit::GetVertexAttribTest(m_context));
	addChild(new VertexAttrib64Bit::LimitTest(m_context));
	addChild(new VertexAttrib64Bit::VAOTest(m_context));
}